

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  longlong lVar7;
  long lVar8;
  uint uVar9;
  ulong idx;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  ImVec2 IVar19;
  float linear_zero_pos;
  float fVar20;
  float fVar21;
  
  pIVar1 = GImGui;
  idx = (ulong)(flags & 1);
  uVar9 = data_type & 0xfffffffe;
  bVar10 = uVar9 == 8;
  bVar11 = power != 1.0;
  fVar13 = ImVec2::operator[](&bb->Max,idx);
  fVar14 = ImVec2::operator[](&bb->Min,idx);
  uVar3 = v_min - v_max;
  uVar5 = -uVar3;
  if (0 < (long)uVar3) {
    uVar5 = uVar3;
  }
  fVar14 = (fVar13 - fVar14) + -4.0;
  fVar13 = (pIVar1->Style).GrabMinSize;
  if (uVar9 != 8) {
    fVar15 = fVar14 / (float)(long)(uVar5 + 1);
    uVar12 = -(uint)(fVar13 <= fVar15);
    fVar13 = (float)(~uVar12 & (uint)fVar13 | (uint)fVar15 & uVar12);
  }
  if (fVar14 <= fVar13) {
    fVar13 = fVar14;
  }
  fVar15 = ImVec2::operator[](&bb->Min,idx);
  fVar16 = ImVec2::operator[](&bb->Max,idx);
  if (v_max * v_min < 0 && (bVar11 && bVar10)) {
    dVar17 = (double)v_min;
    if (v_min < 0) {
      dVar17 = -dVar17;
    }
    dVar17 = pow(dVar17,1.0 / (double)power);
    dVar18 = (double)v_max;
    if (v_max < 0) {
      dVar18 = -dVar18;
    }
    dVar18 = pow(dVar18,1.0 / (double)power);
    linear_zero_pos = (float)(dVar17 / (dVar18 + dVar17));
  }
  else if (v_min < 0) {
    linear_zero_pos = 1.0;
  }
  else {
    linear_zero_pos = 0.0;
  }
  fVar15 = fVar15 + 2.0 + fVar13 * 0.5;
  if (pIVar1->ActiveId == id) {
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar19 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar20 = IVar19.x;
      if (idx != 0) {
        fVar20 = -IVar19.y;
      }
      if ((pIVar1->NavActivatePressedId == id) && (pIVar1->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar20 != 0.0) || (NAN(fVar20))) {
        fVar21 = SliderCalcRatioFromValueT<long_long,double>
                           (data_type,*v,v_min,v_max,power,linear_zero_pos);
        if ((uVar9 != 8) ||
           (iVar2 = ImParseFormatPrecision(format,3), (bool)(~(bVar11 && bVar10) & iVar2 < 1))) {
          if ((uVar5 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            fVar20 = *(float *)(&DAT_0056ed38 + (ulong)(fVar20 < 0.0) * 4) / (float)(long)uVar5;
          }
          else {
            fVar20 = fVar20 / 100.0;
          }
        }
        else {
          fVar20 = fVar20 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar20 = fVar20 / 10.0;
          }
        }
        uVar12 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar20 = (float)(~uVar12 & (uint)fVar20 | (uint)(fVar20 * 10.0) & uVar12);
        if ((1.0 <= fVar21) && (0.0 < fVar20)) {
          bVar11 = false;
          goto LAB_002f5d0e;
        }
        if ((0.0 < fVar21) || (0.0 <= fVar20)) {
          fVar21 = fVar21 + fVar20;
          fVar20 = 1.0;
          if (fVar21 <= 1.0) {
            fVar20 = fVar21;
          }
          fVar20 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar20);
          goto LAB_002f5bd2;
        }
        goto LAB_002f5bb0;
      }
      bVar11 = false;
      goto LAB_002f5d0e;
    }
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if ((pIVar1->IO).MouseDown[0] == false) {
        ClearActiveID();
        bVar11 = false;
        goto LAB_002f5d0e;
      }
      pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,idx);
      fVar20 = 0.0;
      if (0.0 < fVar14 - fVar13) {
        fVar21 = (*pfVar4 - fVar15) / (fVar14 - fVar13);
        fVar20 = 1.0;
        if (fVar21 <= 1.0) {
          fVar20 = fVar21;
        }
        fVar20 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar20);
      }
      if (idx != 0) {
        fVar20 = 1.0 - fVar20;
      }
LAB_002f5bd2:
      if (bVar11 && bVar10) {
        if (linear_zero_pos <= fVar20) {
          uVar9 = -(uint)(1e-06 < ABS(linear_zero_pos + -1.0));
          fVar20 = powf((float)(~uVar9 & (uint)fVar20 |
                               (uint)((fVar20 - linear_zero_pos) / (1.0 - linear_zero_pos)) & uVar9)
                        ,power);
          uVar5 = 0;
          lVar7 = v_max;
          if (0 < v_min) {
            uVar5 = v_min;
          }
        }
        else {
          fVar20 = powf(1.0 - fVar20 / linear_zero_pos,power);
          uVar5 = v_max >> 0x3f & v_max;
          lVar7 = v_min;
        }
        lVar7 = (longlong)((float)(long)(lVar7 - uVar5) * fVar20 + (float)(long)uVar5);
      }
      else if (uVar9 == 8) {
        lVar7 = (longlong)((float)(v_max - v_min) * fVar20 + (float)v_min);
      }
      else {
        fVar20 = fVar20 * (float)(v_max - v_min);
        lVar6 = (long)fVar20;
        lVar8 = (long)(fVar20 + 0.5);
        if (lVar8 < lVar6) {
          lVar8 = lVar6;
        }
        lVar7 = lVar8 + v_min;
      }
      lVar7 = RoundScalarWithFormatT<long_long,long_long>(format,data_type,lVar7);
      bVar11 = *v != lVar7;
      if (bVar11) {
        *v = lVar7;
      }
      goto LAB_002f5d0e;
    }
  }
LAB_002f5bb0:
  bVar11 = false;
LAB_002f5d0e:
  if (1.0 <= fVar14) {
    fVar14 = SliderCalcRatioFromValueT<long_long,double>
                       (data_type,*v,v_min,v_max,power,linear_zero_pos);
    if (idx != 0) {
      fVar14 = 1.0 - fVar14;
    }
    fVar15 = (((fVar16 + -2.0) - fVar13 * 0.5) - fVar15) * fVar14 + fVar15;
    if (idx == 0) {
      fVar14 = (bb->Min).y;
      fVar16 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar13 * 0.5 + fVar15;
      (out_grab_bb->Min).y = fVar14 + 2.0;
      (out_grab_bb->Max).x = fVar13 * 0.5 + fVar15;
      (out_grab_bb->Max).y = fVar16 + -2.0;
    }
    else {
      fVar14 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar13 * 0.5 + fVar15;
      (out_grab_bb->Max).x = fVar14 + -2.0;
      (out_grab_bb->Max).y = fVar13 * 0.5 + fVar15;
    }
  }
  else {
    IVar19 = bb->Min;
    out_grab_bb->Min = IVar19;
    out_grab_bb->Max = IVar19;
  }
  return bVar11;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}